

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O0

void sylvan_gc_aggressive_resize_CALL(WorkerP *w,Task *__dq_head)

{
  size_t current_size;
  size_t sVar1;
  WorkerP *current_size_00;
  WorkerP *pWVar2;
  Task *__dq_head_local;
  WorkerP *w_local;
  size_t new_size_1;
  size_t cache_max;
  size_t cache_size;
  size_t new_size;
  size_t nodes_max;
  size_t nodes_size;
  
  current_size = llmsset_get_size(nodes);
  sVar1 = llmsset_get_max_size(nodes);
  if (current_size < sVar1) {
    cache_size = next_size(current_size);
    if (sVar1 < cache_size) {
      cache_size = sVar1;
    }
    llmsset_set_size(nodes,cache_size);
  }
  current_size_00 = (WorkerP *)cache_getsize();
  pWVar2 = (WorkerP *)cache_getmaxsize();
  if (current_size_00 < pWVar2) {
    w_local = (WorkerP *)next_size((size_t)current_size_00);
    if (pWVar2 < w_local) {
      w_local = pWVar2;
    }
    cache_setsize((size_t)w_local);
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(sylvan_gc_aggressive_resize)
{
    size_t nodes_size = llmsset_get_size(nodes);
    size_t nodes_max = llmsset_get_max_size(nodes);
    if (nodes_size < nodes_max) {
        size_t new_size = next_size(nodes_size);
        if (new_size > nodes_max) new_size = nodes_max;
        llmsset_set_size(nodes, new_size);
    }
    size_t cache_size = cache_getsize();
    size_t cache_max = cache_getmaxsize();
    if (cache_size < cache_max) {
        size_t new_size = next_size(cache_size);
        if (new_size > cache_max) new_size = cache_max;
        cache_setsize(new_size);
    }
}